

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstroke.c
# Opt level: O0

FT_Error FT_Stroker_CubicTo(FT_Stroker stroker,FT_Vector *control1,FT_Vector *control2,FT_Vector *to
                           )

{
  FT_Bool FVar1;
  FT_Error FVar2;
  int iVar3;
  FT_Angle FVar4;
  FT_Angle FVar5;
  FT_Angle FVar6;
  FT_Angle FVar7;
  FT_Fixed FVar8;
  FT_Long length;
  FT_Long FVar9;
  long lVar10;
  FT_Pos FVar11;
  FT_Angle FVar12;
  FT_Fixed FVar13;
  FT_Pos c_;
  FT_Long length_00;
  FT_Fixed alen;
  FT_Fixed sinB;
  FT_Fixed sinA;
  FT_Fixed blen;
  FT_Vector delta;
  FT_Vector bvec;
  FT_Angle gamma;
  FT_Angle beta;
  FT_Angle alpha1;
  FT_Vector start;
  FT_StrokeBorder pFStack_330;
  FT_Int side;
  FT_StrokeBorder border;
  FT_Fixed length2;
  FT_Fixed length1;
  FT_Angle alpha0;
  FT_Angle rotate;
  FT_Angle phi2;
  FT_Angle theta2;
  FT_Angle phi1;
  FT_Angle theta1;
  FT_Vector end;
  FT_Vector ctrl2;
  FT_Vector ctrl1;
  FT_Angle angle_out;
  FT_Angle angle_mid;
  FT_Angle angle_in;
  FT_Vector *pFStack_298;
  FT_Bool first_arc;
  FT_Vector *limit;
  FT_Vector *arc;
  FT_Vector bez_stack [37];
  FT_Error local_2c;
  FT_Error error;
  FT_Vector *to_local;
  FT_Vector *control2_local;
  FT_Vector *control1_local;
  FT_Stroker stroker_local;
  
  local_2c = 0;
  pFStack_298 = (FT_Vector *)&bez_stack[0x1f].y;
  angle_in._7_1_ = '\x01';
  if ((((stroker == (FT_Stroker)0x0) || (control1 == (FT_Vector *)0x0)) ||
      (control2 == (FT_Vector *)0x0)) || (to == (FT_Vector *)0x0)) {
    local_2c = 6;
  }
  else if (((((stroker->center).x - control1->x < -1) || (1 < (stroker->center).x - control1->x)) ||
           (((stroker->center).y - control1->y < -1 ||
            ((1 < (stroker->center).y - control1->y || (control1->x - control2->x < -1)))))) ||
          ((1 < control1->x - control2->x ||
           (((((control1->y - control2->y < -1 || (1 < control1->y - control2->y)) ||
              (control2->x - to->x < -1)) ||
             ((1 < control2->x - to->x || (control2->y - to->y < -1)))) || (1 < control2->y - to->y)
            ))))) {
    limit = (FT_Vector *)&arc;
    arc = (FT_Vector *)to->x;
    bez_stack[0].x = to->y;
    bez_stack[0].y = control2->x;
    bez_stack[1].x = control2->y;
    bez_stack[1].y = control1->x;
    bez_stack[2].x = control1->y;
    bez_stack[2].y = (stroker->center).x;
    bez_stack[3].x = (stroker->center).y;
    while ((FT_Vector *)&arc <= limit) {
      ctrl1.y = stroker->angle_in;
      angle_out = ctrl1.y;
      angle_mid = ctrl1.y;
      if ((limit < pFStack_298) &&
         (FVar1 = ft_cubic_is_small_enough(limit,&angle_mid,&angle_out,&ctrl1.y), FVar1 == '\0')) {
        if (stroker->first_point != '\0') {
          stroker->angle_in = angle_mid;
        }
        ft_cubic_split(limit);
        limit = limit + 3;
      }
      else {
        if (angle_in._7_1_ == '\0') {
          FVar4 = FT_Angle_Diff(stroker->angle_in,angle_mid);
          FVar11 = ft_pos_abs(FVar4);
          if (0x5a000 < FVar11) {
            (stroker->center).x = limit[3].x;
            (stroker->center).y = limit[3].y;
            stroker->angle_out = angle_mid;
            stroker->line_join = FT_STROKER_LINEJOIN_ROUND;
            local_2c = ft_stroker_process_corner(stroker,0);
            stroker->line_join = stroker->line_join_saved;
          }
        }
        else {
          angle_in._7_1_ = '\0';
          if (stroker->first_point == '\0') {
            stroker->angle_out = angle_mid;
            local_2c = ft_stroker_process_corner(stroker,0);
          }
          else {
            local_2c = ft_stroker_subpath_start(stroker,angle_mid,0);
          }
        }
        if (local_2c != 0) {
          return local_2c;
        }
        length1 = 0;
        FVar4 = FT_Angle_Diff(angle_mid,angle_out);
        FVar5 = FT_Angle_Diff(angle_out,ctrl1.y);
        FVar6 = ft_angle_mean(angle_mid,angle_out);
        FVar7 = ft_angle_mean(angle_out,ctrl1.y);
        FVar9 = stroker->radius;
        FVar8 = FT_Cos(FVar4 / 2);
        length = FT_DivFix(FVar9,FVar8);
        FVar9 = stroker->radius;
        FVar8 = FT_Cos(FVar5 / 2);
        FVar9 = FT_DivFix(FVar9,FVar8);
        if (stroker->handle_wide_strokes != '\0') {
          length1 = FT_Atan2(limit->x - limit[3].x,limit->y - limit[3].y);
        }
        pFStack_330 = stroker->borders;
        for (start.y._4_4_ = 0; start.y._4_4_ < 2; start.y._4_4_ = start.y._4_4_ + 1) {
          lVar10 = (long)start.y._4_4_ * -0xb40000 + 0x5a0000;
          FT_Vector_From_Polar((FT_Vector *)&ctrl2.y,length,FVar6 + lVar10);
          ctrl2.y = limit[2].x + ctrl2.y;
          ctrl1.x = limit[2].y + ctrl1.x;
          FT_Vector_From_Polar((FT_Vector *)&end.y,FVar9,FVar7 + lVar10);
          end.y = limit[1].x + end.y;
          ctrl2.x = limit[1].y + ctrl2.x;
          FT_Vector_From_Polar((FT_Vector *)&theta1,stroker->radius,ctrl1.y + lVar10);
          theta1 = limit->x + theta1;
          end.x = limit->y + end.x;
          if (stroker->handle_wide_strokes == '\0') {
LAB_002e127f:
            iVar3 = ft_stroke_border_cubicto
                              (pFStack_330,(FT_Vector *)&ctrl2.y,(FT_Vector *)&end.y,
                               (FT_Vector *)&theta1);
          }
          else {
            alpha1 = pFStack_330->points[pFStack_330->num_points - 1].x;
            start.x = pFStack_330->points[pFStack_330->num_points - 1].y;
            FVar4 = FT_Atan2(theta1 - alpha1,end.x - start.x);
            FVar5 = FT_Angle_Diff(length1,FVar4);
            FVar11 = ft_pos_abs(FVar5);
            if (FVar11 < 0x5a0001) goto LAB_002e127f;
            FVar5 = FT_Atan2(limit[3].x - alpha1,limit[3].y - start.x);
            FVar12 = FT_Atan2(limit->x - theta1,limit->y - end.x);
            delta.y = theta1 - alpha1;
            FVar8 = FT_Vector_Length((FT_Vector *)&delta.y);
            FVar13 = FT_Sin(FVar4 - FVar12);
            FVar11 = ft_pos_abs(FVar13);
            FVar13 = FT_Sin(FVar5 - FVar12);
            c_ = ft_pos_abs(FVar13);
            length_00 = FT_MulDiv(FVar8,FVar11,c_);
            FT_Vector_From_Polar((FT_Vector *)&blen,length_00,FVar5);
            blen = alpha1 + blen;
            delta.x = start.x + delta.x;
            pFStack_330->movable = '\0';
            FVar2 = ft_stroke_border_lineto(pFStack_330,(FT_Vector *)&blen,'\0');
            if (FVar2 != 0) {
              return FVar2;
            }
            FVar2 = ft_stroke_border_lineto(pFStack_330,(FT_Vector *)&theta1,'\0');
            if (FVar2 != 0) {
              return FVar2;
            }
            FVar2 = ft_stroke_border_cubicto
                              (pFStack_330,(FT_Vector *)&end.y,(FT_Vector *)&ctrl2.y,
                               (FT_Vector *)&alpha1);
            if (FVar2 != 0) {
              return FVar2;
            }
            iVar3 = ft_stroke_border_lineto(pFStack_330,(FT_Vector *)&theta1,'\0');
          }
          if (iVar3 != 0) {
            return iVar3;
          }
          pFStack_330 = pFStack_330 + 1;
          local_2c = 0;
        }
        limit = limit + -3;
        stroker->angle_in = ctrl1.y;
      }
    }
    (stroker->center).x = to->x;
    (stroker->center).y = to->y;
  }
  else {
    (stroker->center).x = to->x;
    (stroker->center).y = to->y;
  }
  return local_2c;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Stroker_CubicTo( FT_Stroker  stroker,
                      FT_Vector*  control1,
                      FT_Vector*  control2,
                      FT_Vector*  to )
  {
    FT_Error    error = FT_Err_Ok;
    FT_Vector   bez_stack[37];
    FT_Vector*  arc;
    FT_Vector*  limit = bez_stack + 32;
    FT_Bool     first_arc = TRUE;


    if ( !stroker || !control1 || !control2 || !to )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* if all control points are coincident, this is a no-op; */
    /* avoid creating a spurious corner */
    if ( FT_IS_SMALL( stroker->center.x - control1->x ) &&
         FT_IS_SMALL( stroker->center.y - control1->y ) &&
         FT_IS_SMALL( control1->x       - control2->x ) &&
         FT_IS_SMALL( control1->y       - control2->y ) &&
         FT_IS_SMALL( control2->x       - to->x       ) &&
         FT_IS_SMALL( control2->y       - to->y       ) )
    {
       stroker->center = *to;
       goto Exit;
    }

    arc    = bez_stack;
    arc[0] = *to;
    arc[1] = *control2;
    arc[2] = *control1;
    arc[3] = stroker->center;

    while ( arc >= bez_stack )
    {
      FT_Angle  angle_in, angle_mid, angle_out;


      /* initialize with current direction */
      angle_in = angle_out = angle_mid = stroker->angle_in;

      if ( arc < limit                                         &&
           !ft_cubic_is_small_enough( arc, &angle_in,
                                      &angle_mid, &angle_out ) )
      {
        if ( stroker->first_point )
          stroker->angle_in = angle_in;

        ft_cubic_split( arc );
        arc += 3;
        continue;
      }

      if ( first_arc )
      {
        first_arc = FALSE;

        /* process corner if necessary */
        if ( stroker->first_point )
          error = ft_stroker_subpath_start( stroker, angle_in, 0 );
        else
        {
          stroker->angle_out = angle_in;
          error = ft_stroker_process_corner( stroker, 0 );
        }
      }
      else if ( ft_pos_abs( FT_Angle_Diff( stroker->angle_in, angle_in ) ) >
                  FT_SMALL_CUBIC_THRESHOLD / 4                             )
      {
        /* if the deviation from one arc to the next is too great, */
        /* add a round corner                                      */
        stroker->center    = arc[3];
        stroker->angle_out = angle_in;
        stroker->line_join = FT_STROKER_LINEJOIN_ROUND;

        error = ft_stroker_process_corner( stroker, 0 );

        /* reinstate line join style */
        stroker->line_join = stroker->line_join_saved;
      }

      if ( error )
        goto Exit;

      /* the arc's angle is small enough; we can add it directly to each */
      /* border                                                          */
      {
        FT_Vector        ctrl1, ctrl2, end;
        FT_Angle         theta1, phi1, theta2, phi2, rotate, alpha0 = 0;
        FT_Fixed         length1, length2;
        FT_StrokeBorder  border;
        FT_Int           side;


        theta1  = FT_Angle_Diff( angle_in,  angle_mid ) / 2;
        theta2  = FT_Angle_Diff( angle_mid, angle_out ) / 2;
        phi1    = ft_angle_mean( angle_in,  angle_mid );
        phi2    = ft_angle_mean( angle_mid, angle_out );
        length1 = FT_DivFix( stroker->radius, FT_Cos( theta1 ) );
        length2 = FT_DivFix( stroker->radius, FT_Cos( theta2 ) );

        /* compute direction of original arc */
        if ( stroker->handle_wide_strokes )
          alpha0 = FT_Atan2( arc[0].x - arc[3].x, arc[0].y - arc[3].y );

        for ( border = stroker->borders, side = 0;
              side <= 1;
              side++, border++ )
        {
          rotate = FT_SIDE_TO_ROTATE( side );

          /* compute control points */
          FT_Vector_From_Polar( &ctrl1, length1, phi1 + rotate );
          ctrl1.x += arc[2].x;
          ctrl1.y += arc[2].y;

          FT_Vector_From_Polar( &ctrl2, length2, phi2 + rotate );
          ctrl2.x += arc[1].x;
          ctrl2.y += arc[1].y;

          /* compute end point */
          FT_Vector_From_Polar( &end, stroker->radius, angle_out + rotate );
          end.x += arc[0].x;
          end.y += arc[0].y;

          if ( stroker->handle_wide_strokes )
          {
            FT_Vector  start;
            FT_Angle   alpha1;


            /* determine whether the border radius is greater than the */
            /* radius of curvature of the original arc                 */
            start = border->points[border->num_points - 1];

            alpha1 = FT_Atan2( end.x - start.x, end.y - start.y );

            /* is the direction of the border arc opposite to */
            /* that of the original arc? */
            if ( ft_pos_abs( FT_Angle_Diff( alpha0, alpha1 ) ) >
                   FT_ANGLE_PI / 2                             )
            {
              FT_Angle   beta, gamma;
              FT_Vector  bvec, delta;
              FT_Fixed   blen, sinA, sinB, alen;


              /* use the sine rule to find the intersection point */
              beta  = FT_Atan2( arc[3].x - start.x, arc[3].y - start.y );
              gamma = FT_Atan2( arc[0].x - end.x,   arc[0].y - end.y );

              bvec.x = end.x - start.x;
              bvec.y = end.y - start.y;

              blen = FT_Vector_Length( &bvec );

              sinA = ft_pos_abs( FT_Sin( alpha1 - gamma ) );
              sinB = ft_pos_abs( FT_Sin( beta - gamma ) );

              alen = FT_MulDiv( blen, sinA, sinB );

              FT_Vector_From_Polar( &delta, alen, beta );
              delta.x += start.x;
              delta.y += start.y;

              /* circumnavigate the negative sector backwards */
              border->movable = FALSE;
              error = ft_stroke_border_lineto( border, &delta, FALSE );
              if ( error )
                goto Exit;
              error = ft_stroke_border_lineto( border, &end, FALSE );
              if ( error )
                goto Exit;
              error = ft_stroke_border_cubicto( border,
                                                &ctrl2,
                                                &ctrl1,
                                                &start );
              if ( error )
                goto Exit;
              /* and then move to the endpoint */
              error = ft_stroke_border_lineto( border, &end, FALSE );
              if ( error )
                goto Exit;

              continue;
            }

            /* else fall through */
          }

          /* simply add an arc */
          error = ft_stroke_border_cubicto( border, &ctrl1, &ctrl2, &end );
          if ( error )
            goto Exit;
        }
      }

      arc -= 3;

      stroker->angle_in = angle_out;
    }

    stroker->center = *to;

  Exit:
    return error;
  }